

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::resize
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
           *this,double target_density,bool force_retrain,bool keep_left,bool keep_right)

{
  undefined1 auVar1 [16];
  int iVar2;
  bool bVar3;
  int *piVar4;
  size_t __n;
  unsigned_long *__s;
  LinearModelBuilder<int> *this_00;
  double *pdVar5;
  byte in_CL;
  byte in_DL;
  byte in_SIL;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *in_RDI;
  double in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int i_1;
  int j_1;
  int j;
  int pos;
  int positions_remaining;
  int position;
  const_iterator_type it;
  int keys_remaining;
  int last_position;
  int i;
  LinearModelBuilder<int> builder;
  const_iterator_type it_1;
  int *new_payload_slots;
  int *new_key_slots;
  uint64_t *new_bitmap;
  size_t new_bitmap_size;
  int new_data_capacity;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
  *in_stack_fffffffffffffe48;
  LinearModelBuilder<int> *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe5c;
  undefined1 in_stack_fffffffffffffe5e;
  byte bVar8;
  byte in_stack_fffffffffffffe5f;
  new_allocator<int> *in_stack_fffffffffffffe60;
  Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
  *this_01;
  undefined1 *puVar9;
  double local_158;
  double local_150;
  double local_148;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
  local_120;
  int local_104;
  int local_100;
  int local_fc;
  LinearModelBuilder<int> local_f8;
  Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
  local_80;
  undefined1 local_61 [49];
  unsigned_long *local_30;
  ulong local_28;
  int local_20;
  int local_1c;
  int local_18;
  byte local_13;
  byte local_12;
  byte local_11;
  
  local_11 = in_SIL & 1;
  local_12 = in_DL & 1;
  local_13 = in_CL & 1;
  if (in_RDI->num_keys_ != 0) {
    local_1c = (int)((double)in_RDI->num_keys_ / in_XMM0_Qa);
    local_20 = in_RDI->num_keys_ + 1;
    piVar4 = std::max<int>(&local_1c,&local_20);
    local_18 = *piVar4;
    auVar6._0_8_ = (double)local_18;
    auVar6._8_8_ = in_XMM0_Qb;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = auVar6._0_8_ * 0.015625;
    auVar1 = vroundsd_avx(auVar6,auVar7,10);
    local_28 = vcvttsd2usi_avx512f(auVar1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_28;
    __n = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      __n = 0xffffffffffffffff;
    }
    bitmap_allocator(in_stack_fffffffffffffe48);
    __s = __gnu_cxx::new_allocator<unsigned_long>::allocate
                    ((new_allocator<unsigned_long> *)in_stack_fffffffffffffe60,
                     CONCAT17(in_stack_fffffffffffffe5f,
                              CONCAT16(in_stack_fffffffffffffe5e,
                                       CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)
                                      )),in_stack_fffffffffffffe50);
    memset(__s,0,__n);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x17772f);
    puVar9 = local_61 + 0x10;
    local_30 = __s;
    key_allocator(in_stack_fffffffffffffe48);
    this_00 = (LinearModelBuilder<int> *)
              __gnu_cxx::new_allocator<int>::allocate
                        (in_stack_fffffffffffffe60,
                         CONCAT17(in_stack_fffffffffffffe5f,
                                  CONCAT16(in_stack_fffffffffffffe5e,
                                           CONCAT24(in_stack_fffffffffffffe5c,
                                                    in_stack_fffffffffffffe58))),
                         in_stack_fffffffffffffe50);
    std::allocator<int>::~allocator((allocator<int> *)0x17777f);
    this_01 = (Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
               *)local_61;
    local_61._17_8_ = this_00;
    payload_allocator(in_stack_fffffffffffffe48);
    piVar4 = __gnu_cxx::new_allocator<int>::allocate
                       ((new_allocator<int> *)this_01,
                        CONCAT17(in_stack_fffffffffffffe5f,
                                 CONCAT16(in_stack_fffffffffffffe5e,
                                          CONCAT24(in_stack_fffffffffffffe5c,
                                                   in_stack_fffffffffffffe58))),
                        in_stack_fffffffffffffe50);
    std::allocator<int>::~allocator((allocator<int> *)0x1777cd);
    local_61._1_8_ = piVar4;
    if ((in_RDI->num_keys_ < 0x32) || ((local_11 & 1) != 0)) {
      Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
      ::Iterator((Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
                  *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,0);
      LinearModelBuilder<int>::LinearModelBuilder
                (in_stack_fffffffffffffe50,(LinearModel<int> *)in_stack_fffffffffffffe48);
      local_fc = 0;
      while( true ) {
        in_stack_fffffffffffffe5f = 0;
        if (local_80.cur_idx_ < in_RDI->data_capacity_) {
          bVar3 = Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
                  ::is_end(&local_80);
          in_stack_fffffffffffffe5f = bVar3 ^ 0xff;
        }
        if ((in_stack_fffffffffffffe5f & 1) == 0) break;
        Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
        ::key(&local_80);
        LinearModelBuilder<int>::add(this_00,(int)((ulong)puVar9 >> 0x20),(int)puVar9);
        Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
        ::operator++(this_01,CONCAT13(in_stack_fffffffffffffe5f,
                                      CONCAT12(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe5c))
                    );
        local_fc = local_fc + 1;
      }
      LinearModelBuilder<int>::build(&local_f8);
      if ((local_12 & 1) == 0) {
        if ((local_13 & 1) == 0) {
          LinearModel<int>::expand
                    (&(in_RDI->super_AlexNode<int,_int>).model_,
                     (double)local_18 / (double)in_RDI->num_keys_);
        }
        else {
          LinearModel<int>::expand
                    (&(in_RDI->super_AlexNode<int,_int>).model_,
                     (double)in_RDI->data_capacity_ / (double)in_RDI->num_keys_);
          (in_RDI->super_AlexNode<int,_int>).model_.b_ =
               (double)(local_18 - in_RDI->data_capacity_) +
               (in_RDI->super_AlexNode<int,_int>).model_.b_;
        }
      }
      else {
        LinearModel<int>::expand
                  (&(in_RDI->super_AlexNode<int,_int>).model_,
                   (double)in_RDI->data_capacity_ / (double)in_RDI->num_keys_);
      }
    }
    else if ((local_13 & 1) == 0) {
      if ((local_12 & 1) == 0) {
        LinearModel<int>::expand
                  (&(in_RDI->super_AlexNode<int,_int>).model_,
                   (double)local_18 / (double)in_RDI->data_capacity_);
      }
    }
    else {
      (in_RDI->super_AlexNode<int,_int>).model_.b_ =
           (double)(local_18 - in_RDI->data_capacity_) +
           (in_RDI->super_AlexNode<int,_int>).model_.b_;
    }
    local_100 = -1;
    local_104 = in_RDI->num_keys_;
    Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
    ::Iterator((Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
                *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,0);
    while( true ) {
      bVar8 = 0;
      if (local_120.cur_idx_ < in_RDI->data_capacity_) {
        bVar3 = Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
                ::is_end(&local_120);
        bVar8 = bVar3 ^ 0xff;
      }
      local_13c = local_100;
      if ((bVar8 & 1) == 0) goto LAB_00177d0a;
      in_stack_fffffffffffffe50 =
           (LinearModelBuilder<int> *)&(in_RDI->super_AlexNode<int,_int>).model_;
      piVar4 = Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
               ::key(&local_120);
      local_124 = LinearModel<int>::predict((LinearModel<int> *)in_stack_fffffffffffffe50,*piVar4);
      local_128 = local_100 + 1;
      piVar4 = std::max<int>(&local_124,&local_128);
      local_124 = *piVar4;
      local_12c = local_18 - local_124;
      iVar2 = local_100;
      if (local_12c < local_104) break;
      while (local_138 = iVar2 + 1, local_138 < local_124) {
        piVar4 = Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
                 ::key(&local_120);
        *(int *)((long)(LinearModel<int> **)local_61._17_8_ + (long)local_138 * 4) = *piVar4;
        iVar2 = local_138;
      }
      piVar4 = Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
               ::key(&local_120);
      *(int *)((long)(LinearModel<int> **)local_61._17_8_ + (long)local_124 * 4) = *piVar4;
      piVar4 = Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
               ::payload(&local_120);
      *(int *)(local_61._1_8_ + (long)local_124 * 4) = *piVar4;
      set_bit(in_RDI,local_30,local_124);
      local_100 = local_124;
      local_104 = local_104 + -1;
      Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
      ::operator++(this_01,CONCAT13(in_stack_fffffffffffffe5f,
                                    CONCAT12(bVar8,in_stack_fffffffffffffe5c)));
    }
    local_130 = local_18 - local_104;
    local_134 = local_100;
    while (local_134 = local_134 + 1, local_134 < local_130) {
      piVar4 = Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
               ::key(&local_120);
      *(int *)((long)(LinearModel<int> **)local_61._17_8_ + (long)local_134 * 4) = *piVar4;
    }
    while (local_130 < local_18) {
      piVar4 = Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
               ::key(&local_120);
      *(int *)((long)(LinearModel<int> **)local_61._17_8_ + (long)local_130 * 4) = *piVar4;
      piVar4 = Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
               ::payload(&local_120);
      *(int *)(local_61._1_8_ + (long)local_130 * 4) = *piVar4;
      set_bit(in_RDI,local_30,local_130);
      local_130 = local_130 + 1;
      Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
      ::operator++(this_01,CONCAT13(in_stack_fffffffffffffe5f,
                                    CONCAT12(bVar8,in_stack_fffffffffffffe5c)));
    }
    local_13c = local_130 + -1;
    local_100 = local_13c;
LAB_00177d0a:
    while (local_13c = local_13c + 1, local_13c < local_18) {
      *(int *)((long)(LinearModel<int> **)local_61._17_8_ + (long)local_13c * 4) = 0x7fffffff;
    }
    key_allocator(in_stack_fffffffffffffe48);
    __gnu_cxx::new_allocator<int>::deallocate
              ((new_allocator<int> *)in_stack_fffffffffffffe50,(int *)in_stack_fffffffffffffe48,
               0x177d5e);
    std::allocator<int>::~allocator((allocator<int> *)0x177d68);
    payload_allocator(in_stack_fffffffffffffe48);
    __gnu_cxx::new_allocator<int>::deallocate
              ((new_allocator<int> *)in_stack_fffffffffffffe50,(int *)in_stack_fffffffffffffe48,
               0x177d8e);
    std::allocator<int>::~allocator((allocator<int> *)0x177d98);
    bitmap_allocator(in_stack_fffffffffffffe48);
    __gnu_cxx::new_allocator<unsigned_long>::deallocate
              ((new_allocator<unsigned_long> *)in_stack_fffffffffffffe50,
               (unsigned_long *)in_stack_fffffffffffffe48,0x177dbe);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x177dc8);
    in_RDI->data_capacity_ = local_18;
    in_RDI->bitmap_size_ = (int)local_28;
    in_RDI->key_slots_ = (int *)local_61._17_8_;
    in_RDI->payload_slots_ = (int *)local_61._1_8_;
    in_RDI->bitmap_ = local_30;
    local_148 = (double)in_RDI->data_capacity_ * 0.8;
    local_150 = (double)(in_RDI->num_keys_ + 1);
    pdVar5 = std::max<double>(&local_148,&local_150);
    local_158 = (double)in_RDI->data_capacity_;
    pdVar5 = std::min<double>(pdVar5,&local_158);
    in_RDI->expansion_threshold_ = *pdVar5;
    in_RDI->contraction_threshold_ = (double)in_RDI->data_capacity_ * 0.6;
  }
  return;
}

Assistant:

void resize(double target_density, bool force_retrain = false,
              bool keep_left = false, bool keep_right = false) {
    if (num_keys_ == 0) {
      return;
    }

    int new_data_capacity =
        std::max(static_cast<int>(num_keys_ / target_density), num_keys_ + 1);
    auto new_bitmap_size =
        static_cast<size_t>(std::ceil(new_data_capacity / 64.));
    auto new_bitmap = new (bitmap_allocator().allocate(new_bitmap_size))
        uint64_t[new_bitmap_size]();  // initialize to all false
#if ALEX_DATA_NODE_SEP_ARRAYS
    T* new_key_slots =
        new (key_allocator().allocate(new_data_capacity)) T[new_data_capacity];
    P* new_payload_slots = new (payload_allocator().allocate(new_data_capacity))
        P[new_data_capacity];
#else
    V* new_data_slots = new (value_allocator().allocate(new_data_capacity))
        V[new_data_capacity];
#endif

    // Retrain model if the number of keys is sufficiently small (under 50)
    if (num_keys_ < 50 || force_retrain) {
      const_iterator_type it(this, 0);
      LinearModelBuilder<T> builder(&(this->model_));
      for (int i = 0; it.cur_idx_ < data_capacity_ && !it.is_end(); it++, i++) {
        builder.add(it.key(), i);
      }
      builder.build();
      if (keep_left) {
        this->model_.expand(static_cast<double>(data_capacity_) / num_keys_);
      } else if (keep_right) {
        this->model_.expand(static_cast<double>(data_capacity_) / num_keys_);
        this->model_.b_ += (new_data_capacity - data_capacity_);
      } else {
        this->model_.expand(static_cast<double>(new_data_capacity) / num_keys_);
      }
    } else {
      if (keep_right) {
        this->model_.b_ += (new_data_capacity - data_capacity_);
      } else if (!keep_left) {
        this->model_.expand(static_cast<double>(new_data_capacity) /
                            data_capacity_);
      }
    }

    int last_position = -1;
    int keys_remaining = num_keys_;
    const_iterator_type it(this, 0);
    for (; it.cur_idx_ < data_capacity_ && !it.is_end(); it++) {
      int position = this->model_.predict(it.key());
      position = std::max<int>(position, last_position + 1);

      int positions_remaining = new_data_capacity - position;
      if (positions_remaining < keys_remaining) {
        // fill the rest of the store contiguously
        int pos = new_data_capacity - keys_remaining;
        for (int j = last_position + 1; j < pos; j++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
          new_key_slots[j] = it.key();
#else
          new_data_slots[j].first = it.key();
#endif
        }
        for (; pos < new_data_capacity; pos++, it++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
          new_key_slots[pos] = it.key();
          new_payload_slots[pos] = it.payload();
#else
          new_data_slots[pos] = *it;
#endif
          set_bit(new_bitmap, pos);
        }
        last_position = pos - 1;
        break;
      }

      for (int j = last_position + 1; j < position; j++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
        new_key_slots[j] = it.key();
#else
        new_data_slots[j].first = it.key();
#endif
      }

#if ALEX_DATA_NODE_SEP_ARRAYS
      new_key_slots[position] = it.key();
      new_payload_slots[position] = it.payload();
#else
      new_data_slots[position] = *it;
#endif
      set_bit(new_bitmap, position);

      last_position = position;

      keys_remaining--;
    }

    for (int i = last_position + 1; i < new_data_capacity; i++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
      new_key_slots[i] = kEndSentinel_;
#else
      new_data_slots[i].first = kEndSentinel;
#endif
    }

#if ALEX_DATA_NODE_SEP_ARRAYS
    key_allocator().deallocate(key_slots_, data_capacity_);
    payload_allocator().deallocate(payload_slots_, data_capacity_);
#else
    value_allocator().deallocate(data_slots_, data_capacity_);
#endif
    bitmap_allocator().deallocate(bitmap_, bitmap_size_);

    data_capacity_ = new_data_capacity;
    bitmap_size_ = new_bitmap_size;
#if ALEX_DATA_NODE_SEP_ARRAYS
    key_slots_ = new_key_slots;
    payload_slots_ = new_payload_slots;
#else
    data_slots_ = new_data_slots;
#endif
    bitmap_ = new_bitmap;

    expansion_threshold_ =
        std::min(std::max(data_capacity_ * kMaxDensity_,
                          static_cast<double>(num_keys_ + 1)),
                 static_cast<double>(data_capacity_));
    contraction_threshold_ = data_capacity_ * kMinDensity_;
  }